

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

bool __thiscall NaPetriNet::ask_for_node(NaPetriNet *this,NaPetriNode *pNode,int *pIndex)

{
  int iVar1;
  NaPetriNode **ppNVar2;
  int *in_RDX;
  NaPetriNode *in_RSI;
  long in_RDI;
  int i;
  int in_stack_ffffffffffffffbc;
  NaPetriNode *pNVar3;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    iVar1 = NaDynAr<NaPetriNode_*>::count((NaDynAr<NaPetriNode_*> *)(in_RDI + 0x40));
    if (iVar1 <= local_24) {
      return false;
    }
    pNVar3 = in_RSI;
    ppNVar2 = NaDynAr<NaPetriNode_*>::operator[]
                        ((NaDynAr<NaPetriNode_*> *)in_RSI,in_stack_ffffffffffffffbc);
    if (pNVar3 == *ppNVar2) break;
    local_24 = local_24 + 1;
  }
  if (in_RDX != (int *)0x0) {
    *in_RDX = local_24;
  }
  return true;
}

Assistant:

bool
NaPetriNet::ask_for_node (NaPetriNode* pNode, int *pIndex)
{
    int i;
    for(i = 0; i < pnaNet.count(); ++i){
        if(pNode == pnaNet[i]){
            if(NULL != pIndex){
                *pIndex = i;
            }
            return true;
        }
    }
    return false;
}